

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

pool_ptr<soul::heart::Function> __thiscall
soul::heart::Parser::findFunction(Parser *this,string *name,ArrayView<soul::Type> argTypes)

{
  undefined4 uVar1;
  size_t sVar2;
  size_type sVar3;
  undefined4 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  long lVar8;
  Function *fn_00;
  Function *pFVar9;
  Type *pTVar10;
  pool_ref<soul::heart::Function> *fn;
  long *plVar11;
  Type *in_R8;
  long *plVar12;
  _func_int **pp_Var13;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::Type> argTypes_01;
  string_view other;
  string local_58;
  long *local_38;
  
  fn_00 = (Function *)argTypes.e;
  pTVar10 = argTypes.s;
  pFVar9 = fn_00;
  lVar8 = std::__cxx11::string::find((char)argTypes.s,0x3a);
  if (lVar8 == -1) {
    sVar3 = name[4]._M_string_length;
    if (sVar3 == 0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    if (*(long *)(sVar3 + 0x138) != 0) {
      plVar11 = *(long **)(sVar3 + 0x130);
      lVar8 = *(long *)(sVar3 + 0x138) << 3;
      pp_Var13 = (_func_int **)0x0;
      do {
        uVar1 = pTVar10->boundingSize;
        uVar4 = pTVar10->arrayElementBoundingSize;
        other._M_len._4_4_ = uVar4;
        other._M_len._0_4_ = uVar1;
        other._M_str = *(char **)pTVar10;
        bVar6 = Identifier::operator==((Identifier *)(*plVar11 + 0x30),other);
        if ((bVar6) &&
           (argTypes_01.e = (Type *)pFVar9, argTypes_01.s = in_R8,
           bVar6 = functionArgTypesMatch((Parser *)*plVar11,fn_00,argTypes_01), bVar6))
        goto LAB_002315a3;
        plVar11 = plVar11 + 1;
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
      goto LAB_002315ab;
    }
  }
  else {
    lVar8 = *(long *)((long)&name[3].field_2 + 8);
    plVar12 = *(long **)(lVar8 + 0x40);
    local_38 = *(long **)(lVar8 + 0x48);
    if (plVar12 != local_38) {
      do {
        lVar8 = *(long *)(*plVar12 + 0x138);
        if (lVar8 != 0) {
          plVar11 = *(long **)(*plVar12 + 0x130);
          lVar8 = lVar8 << 3;
          do {
            if (*(string **)(*plVar11 + 0x30) == (string *)0x0) {
              throwInternalCompilerError
                        ("isValid()","operator const std::basic_string<char> &",0x21);
            }
            TokenisedPathString::join
                      (&local_58,(string *)(*plVar12 + 0x30),*(string **)(*plVar11 + 0x30));
            _Var5._M_p = local_58._M_dataplus._M_p;
            sVar2._0_4_ = pTVar10->boundingSize;
            sVar2._4_4_ = pTVar10->arrayElementBoundingSize;
            if ((local_58._M_string_length == sVar2) &&
               ((local_58._M_string_length == 0 ||
                (iVar7 = bcmp(local_58._M_dataplus._M_p,*(void **)pTVar10,local_58._M_string_length)
                , iVar7 == 0)))) {
              argTypes_00.e = (Type *)pFVar9;
              argTypes_00.s = in_R8;
              bVar6 = functionArgTypesMatch((Parser *)*plVar11,fn_00,argTypes_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar6) goto LAB_002315a3;
            }
            else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var5._M_p != &local_58.field_2) {
              operator_delete(_Var5._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            plVar11 = plVar11 + 1;
            lVar8 = lVar8 + -8;
          } while (lVar8 != 0);
        }
        plVar12 = plVar12 + 1;
      } while (plVar12 != local_38);
    }
  }
  pp_Var13 = (_func_int **)0x0;
  goto LAB_002315ab;
LAB_002315a3:
  pp_Var13 = (_func_int **)*plVar11;
LAB_002315ab:
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = pp_Var13;
  return (pool_ptr<soul::heart::Function>)(Function *)this;
}

Assistant:

pool_ptr<heart::Function> findFunction (const std::string& name, ArrayView<Type> argTypes)
    {
        if (! containsChar (name, ':'))
        {
            for (auto& fn : module->functions.get())
                if (fn->name == name && functionArgTypesMatch (fn, argTypes))
                    return fn;
        }
        else
        {
            for (auto& m : program.getModules())
                for (auto& fn : m->functions.get())
                    if (TokenisedPathString::join (m->fullName, fn->name) == name && functionArgTypesMatch (fn, argTypes))
                        return fn;
        }

        return {};
    }